

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O2

int rnndec_varmod(rnndeccontext *ctx,char *varset,char *variant)

{
  int iVar1;
  rnnenum *prVar2;
  rnndecvariant *prVar3;
  ulong uVar4;
  rnnenum *prVar5;
  ulong uVar6;
  rnndecvariant *prVar7;
  ulong uVar8;
  
  prVar2 = rnn_findenum(ctx->db,varset);
  if (prVar2 == (rnnenum *)0x0) {
    fprintf(_stderr,"Enum %s doesn\'t exist in database!\n",varset);
    return 0;
  }
  uVar8 = 0;
  uVar4 = (ulong)(uint)prVar2->valsnum;
  if (prVar2->valsnum < 1) {
    uVar4 = uVar8;
  }
  while( true ) {
    if (uVar4 == uVar8) {
      fprintf(_stderr,"Variant %s doesn\'t exist in enum %s!\n",variant,varset);
      return 0;
    }
    iVar1 = strcasecmp(prVar2->vals[uVar8]->name,variant);
    if (iVar1 == 0) break;
    uVar8 = uVar8 + 1;
  }
  uVar6 = 0;
  uVar4 = (ulong)(uint)ctx->varsnum;
  if (ctx->varsnum < 1) {
    uVar4 = uVar6;
  }
  prVar3 = (rnndecvariant *)0x0;
  do {
    if (uVar4 == uVar6) {
      prVar5 = prVar3->en;
      break;
    }
    prVar3 = ctx->vars[uVar6];
    uVar6 = uVar6 + 1;
    prVar5 = prVar2;
  } while (prVar3->en != prVar2);
  prVar7 = (rnndecvariant *)0x0;
  if (prVar5 == prVar2) {
    prVar7 = prVar3;
  }
  prVar7->variant = (int)uVar8;
  return 1;
}

Assistant:

int rnndec_varmod(struct rnndeccontext *ctx, char *varset, char *variant) {
	struct rnnenum *en = rnn_findenum(ctx->db, varset);
	if (!en) {
		fprintf (stderr, "Enum %s doesn't exist in database!\n", varset);
		return 0;
	}
	int i;
	for (i = 0; i < en->valsnum; i++)
		if (!strcasecmp(en->vals[i]->name, variant)) {
			struct rnndecvariant *ci = NULL;
			FINDARRAY(ctx->vars, ci, ci->en == en);
			ci->variant = i;
			return 1;
		}
	fprintf (stderr, "Variant %s doesn't exist in enum %s!\n", variant, varset);
	return 0;
}